

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  int *piVar1;
  VP8LColorCache *src;
  VP8LColorCache *dst;
  uint32_t *puVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  vp8l_val_t vVar9;
  uint8_t *puVar10;
  size_t sVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  HuffmanCode *pHVar23;
  VP8LColorCache *pVVar24;
  HTreeGroup *pHVar25;
  ulong uVar26;
  uint32_t uVar27;
  uint uVar28;
  int iVar29;
  uint32_t *puVar30;
  uint32_t *puVar31;
  bool bVar32;
  
  iVar29 = dec->last_pixel;
  uVar7 = (long)iVar29 / (long)width;
  uVar8 = (long)iVar29 % (long)width;
  uVar20 = uVar8 & 0xffffffff;
  uVar15 = uVar7 & 0xffffffff;
  iVar5 = (dec->hdr).color_cache_size;
  uVar26 = 0x1000000;
  if (dec->incremental != 0) {
    uVar26 = uVar15;
  }
  src = &(dec->hdr).color_cache;
  pHVar25 = (HTreeGroup *)0x0;
  pVVar24 = (VP8LColorCache *)0x0;
  if (0 < iVar5) {
    pVVar24 = src;
  }
  if (iVar29 < last_row * width) {
    iVar17 = (dec->hdr).huffman_subsample_bits;
    if (iVar17 == 0) {
      lVar19 = 0;
    }
    else {
      bVar16 = (byte)iVar17;
      lVar19 = (long)(int)(dec->hdr).huffman_image
                          [((int)uVar8 >> (bVar16 & 0x1f)) +
                           ((int)uVar7 >> (bVar16 & 0x1f)) * (dec->hdr).huffman_xsize];
    }
    pHVar25 = (dec->hdr).htree_groups + lVar19;
  }
  br = &dec->br;
  puVar31 = data + iVar29;
  puVar2 = data + last_row * width;
  uVar14 = (dec->hdr).huffman_mask;
  dst = &(dec->hdr).saved_color_cache;
  puVar21 = puVar31;
  do {
    iVar29 = (int)uVar15;
    uVar28 = (uint)uVar20;
    puVar22 = puVar21;
    if (puVar2 <= puVar21) goto LAB_0013faee;
    if ((int)uVar26 <= iVar29) {
      iVar17 = (dec->br).eos;
      (dec->saved_br).bit_pos = (dec->br).bit_pos;
      (dec->saved_br).eos = iVar17;
      vVar9 = br->val;
      puVar10 = (dec->br).buf;
      sVar11 = (dec->br).pos;
      (dec->saved_br).len = (dec->br).len;
      (dec->saved_br).pos = sVar11;
      (dec->saved_br).val = vVar9;
      (dec->saved_br).buf = puVar10;
      dec->saved_last_pixel = (int)((ulong)((long)puVar21 - (long)data) >> 2);
      if (0 < (dec->hdr).color_cache_size) {
        VP8LColorCacheCopy(src,dst);
      }
      uVar26 = (ulong)(iVar29 + 8);
    }
    if ((uVar14 & uVar28) == 0) {
      iVar17 = (dec->hdr).huffman_subsample_bits;
      if (iVar17 == 0) {
        lVar19 = 0;
      }
      else {
        bVar16 = (byte)iVar17;
        lVar19 = (long)(int)(dec->hdr).huffman_image
                            [((int)uVar28 >> (bVar16 & 0x1f)) +
                             (iVar29 >> (bVar16 & 0x1f)) * (dec->hdr).huffman_xsize];
      }
      pHVar25 = (dec->hdr).htree_groups + lVar19;
    }
    if (pHVar25->is_trivial_code != 0) {
      uVar27 = pHVar25->literal_arb;
      goto LAB_0013f404;
    }
    if (0x1f < (dec->br).bit_pos) {
      VP8LDoFillBitWindow(br);
    }
    if (pHVar25->use_packed_table == 0) {
      uVar7 = (dec->br).val;
      iVar17 = (dec->br).bit_pos;
      pHVar23 = pHVar25->htrees[0] + (uVar7 >> ((byte)iVar17 & 0x3f) & 0xff);
      bVar16 = pHVar23->bits;
      if (8 < bVar16) {
        iVar17 = iVar17 + 8;
        (dec->br).bit_pos = iVar17;
        pHVar23 = pHVar23 + (ulong)pHVar23->value +
                            (ulong)(~(-1 << (bVar16 - 8 & 0x1f)) &
                                   (uint)(uVar7 >> ((byte)iVar17 & 0x3f)));
      }
      piVar1 = &(dec->br).bit_pos;
      *piVar1 = *piVar1 + (uint)pHVar23->bits;
      uVar27 = (uint32_t)pHVar23->value;
LAB_0013f5c4:
      iVar17 = 3;
      if (((dec->br).eos == 0) && (((dec->br).pos != (dec->br).len || ((dec->br).bit_pos < 0x41))))
      {
        if ((int)uVar27 < 0x100) {
          if (pHVar25->is_trivial_literal != 0) {
            uVar27 = uVar27 << 8 | pHVar25->literal_arb;
LAB_0013f404:
            *puVar21 = uVar27;
            goto LAB_0013f408;
          }
          uVar7 = (dec->br).val;
          iVar17 = (dec->br).bit_pos;
          pHVar23 = pHVar25->htrees[1] + (uVar7 >> ((byte)iVar17 & 0x3f) & 0xff);
          bVar16 = pHVar23->bits;
          if (8 < bVar16) {
            iVar17 = iVar17 + 8;
            (dec->br).bit_pos = iVar17;
            pHVar23 = pHVar23 + (ulong)pHVar23->value +
                                (ulong)(~(-1 << (bVar16 - 8 & 0x1f)) &
                                       (uint)(uVar7 >> ((byte)iVar17 & 0x3f)));
          }
          iVar17 = (uint)pHVar23->bits + (dec->br).bit_pos;
          (dec->br).bit_pos = iVar17;
          uVar3 = pHVar23->value;
          if (0x1f < iVar17) {
            VP8LDoFillBitWindow(br);
          }
          uVar7 = (dec->br).val;
          iVar17 = (dec->br).bit_pos;
          pHVar23 = pHVar25->htrees[2] + (uVar7 >> ((byte)iVar17 & 0x3f) & 0xff);
          bVar16 = pHVar23->bits;
          if (8 < bVar16) {
            iVar17 = iVar17 + 8;
            (dec->br).bit_pos = iVar17;
            pHVar23 = pHVar23 + (ulong)pHVar23->value +
                                (ulong)(~(-1 << (bVar16 - 8 & 0x1f)) &
                                       (uint)(uVar7 >> ((byte)iVar17 & 0x3f)));
          }
          iVar17 = (uint)pHVar23->bits + (dec->br).bit_pos;
          (dec->br).bit_pos = iVar17;
          uVar4 = pHVar23->value;
          pHVar23 = pHVar25->htrees[3] + (uVar7 >> ((byte)iVar17 & 0x3f) & 0xff);
          bVar16 = pHVar23->bits;
          if (8 < bVar16) {
            (dec->br).bit_pos = iVar17 + 8;
            pHVar23 = pHVar23 + (ulong)pHVar23->value +
                                (ulong)(~(-1 << (bVar16 - 8 & 0x1f)) &
                                       (uint)(uVar7 >> ((byte)(iVar17 + 8) & 0x3f)));
          }
          iVar17 = (uint)pHVar23->bits + (dec->br).bit_pos;
          (dec->br).bit_pos = iVar17;
          if ((dec->br).eos == 0) {
            bVar32 = iVar17 < 0x41 || (dec->br).pos != (dec->br).len;
          }
          else {
            bVar32 = false;
          }
          iVar17 = 3;
          if (bVar32) {
            *puVar21 = uVar27 << 8 | (uint)uVar3 << 0x10 | (uint)uVar4 |
                       (uint)pHVar23->value << 0x18;
            goto LAB_0013f408;
          }
        }
        else if ((int)uVar27 < 0x118) {
          if ((int)uVar27 < 0x104) {
            iVar29 = uVar27 - 0x100;
          }
          else {
            uVar12 = uVar27 - 0x102 >> 1;
            uVar13 = VP8LReadBits(br,uVar12);
            iVar29 = uVar13 + ((uVar27 & 1 | 2) << ((byte)uVar12 & 0x1f));
          }
          uVar7 = (dec->br).val;
          iVar18 = (dec->br).bit_pos;
          pHVar23 = pHVar25->htrees[4] + (uVar7 >> ((byte)iVar18 & 0x3f) & 0xff);
          bVar16 = pHVar23->bits;
          if (8 < bVar16) {
            iVar18 = iVar18 + 8;
            (dec->br).bit_pos = iVar18;
            pHVar23 = pHVar23 + (ulong)pHVar23->value +
                                (ulong)(~(-1 << (bVar16 - 8 & 0x1f)) &
                                       (uint)(uVar7 >> ((byte)iVar18 & 0x3f)));
          }
          iVar18 = (uint)pHVar23->bits + (dec->br).bit_pos;
          (dec->br).bit_pos = iVar18;
          uVar3 = pHVar23->value;
          uVar12 = (uint)uVar3;
          if (0x1f < iVar18) {
            VP8LDoFillBitWindow(br);
          }
          if (3 < uVar3) {
            uVar12 = uVar3 - 2 >> 1;
            uVar27 = VP8LReadBits(br,uVar12);
            uVar12 = uVar27 + ((uVar3 & 1 | 2) << ((byte)uVar12 & 0x1f));
          }
          if ((int)(uVar12 + 1) < 0x79) {
            iVar18 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                             [(int)uVar12] >> 4) * width -
                     ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                      [(int)uVar12] & 0xf)) + 8;
            if (iVar18 < 2) {
              iVar18 = 1;
            }
          }
          else {
            iVar18 = uVar12 - 0x77;
          }
          if (((dec->br).eos == 0) &&
             ((((dec->br).pos != (dec->br).len || ((dec->br).bit_pos < 0x41)) &&
              (iVar17 = 7, (long)iVar18 <= (long)puVar21 - (long)data >> 2)))) {
            iVar29 = iVar29 + 1;
            if ((long)iVar29 <= (long)data + ((long)(height * width) * 4 - (long)puVar21) >> 2) {
              CopyBlock32b(puVar21,iVar18,iVar29);
              uVar28 = uVar28 + iVar29;
              while( true ) {
                uVar20 = (ulong)uVar28;
                iVar17 = (int)uVar15;
                if ((int)uVar28 < width) break;
                uVar12 = iVar17 + 1;
                uVar15 = (ulong)uVar12;
                if ((uVar12 & 0xf) == 0 &&
                    (iVar17 < last_row && process_func != (ProcessRowsFunc)0x0)) {
                  (*process_func)(dec,uVar12);
                }
                uVar28 = uVar28 - width;
              }
              if ((uVar14 & uVar28) != 0) {
                iVar18 = (dec->hdr).huffman_subsample_bits;
                if (iVar18 == 0) {
                  lVar19 = 0;
                }
                else {
                  bVar16 = (byte)iVar18;
                  lVar19 = (long)(int)(dec->hdr).huffman_image
                                      [((int)uVar28 >> (bVar16 & 0x1f)) +
                                       (iVar17 >> (bVar16 & 0x1f)) * (dec->hdr).huffman_xsize];
                }
                pHVar25 = (dec->hdr).htree_groups + lVar19;
              }
              puVar22 = puVar21 + iVar29;
              iVar17 = 0;
              if ((0 < iVar5) && (iVar17 = 0, puVar31 < puVar22)) {
                puVar21 = pVVar24->colors;
                do {
                  uVar27 = *puVar31;
                  puVar31 = puVar31 + 1;
                  puVar21[(int)(uVar27 * 0x1e35a7bd >> ((byte)pVVar24->hash_shift & 0x1f))] = uVar27
                  ;
                } while (puVar31 < puVar22);
              }
            }
          }
        }
        else {
          iVar17 = 7;
          if ((int)uVar27 < iVar5 + 0x118) {
            if (puVar31 < puVar21) {
              puVar22 = pVVar24->colors;
              do {
                uVar13 = *puVar31;
                puVar31 = puVar31 + 1;
                puVar22[(int)(uVar13 * 0x1e35a7bd >> ((byte)pVVar24->hash_shift & 0x1f))] = uVar13;
              } while (puVar31 < puVar21);
            }
            uVar27 = pVVar24->colors[(ulong)uVar27 - 0x118];
            goto LAB_0013f404;
          }
        }
      }
    }
    else {
      iVar17 = (dec->br).bit_pos;
      uVar12 = (uint)((dec->br).val >> ((byte)iVar17 & 0x3f)) & 0x3f;
      iVar18 = pHVar25->packed_table[uVar12].bits;
      uVar27 = pHVar25->packed_table[uVar12].value;
      iVar17 = iVar17 + iVar18;
      if (iVar18 < 0x100) {
        (dec->br).bit_pos = iVar17;
        *puVar21 = uVar27;
        uVar27 = 0;
      }
      else {
        (dec->br).bit_pos = iVar17 + -0x100;
      }
      iVar17 = 3;
      if (((dec->br).eos == 0) && (((dec->br).pos != (dec->br).len || ((dec->br).bit_pos < 0x41))))
      {
        if (uVar27 != 0) goto LAB_0013f5c4;
LAB_0013f408:
        puVar22 = puVar21 + 1;
        uVar20 = (ulong)(uVar28 + 1);
        iVar17 = 0;
        if (width <= (int)(uVar28 + 1)) {
          uVar28 = iVar29 + 1;
          if ((uVar28 & 0xf) == 0 && (iVar29 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar28);
          }
          iVar17 = 0;
          if ((iVar5 < 1) || (puVar22 <= puVar31)) {
            uVar20 = 0;
            uVar15 = (ulong)uVar28;
          }
          else {
            puVar6 = pVVar24->colors;
            puVar30 = puVar31;
            do {
              puVar31 = puVar30 + 1;
              puVar6[(int)(*puVar30 * 0x1e35a7bd >> ((byte)pVVar24->hash_shift & 0x1f))] = *puVar30;
              bVar32 = puVar30 < puVar21;
              puVar30 = puVar31;
            } while (bVar32);
            uVar20 = 0;
            uVar15 = (ulong)uVar28;
          }
        }
      }
    }
    iVar29 = (int)uVar15;
    puVar21 = puVar22;
  } while (iVar17 == 0);
  if (iVar17 != 7) {
    if (iVar17 != 3) goto LAB_0013fbd6;
LAB_0013faee:
    uVar14 = 1;
    if (((dec->br).eos == 0) && (uVar14 = 0, (dec->br).pos == (dec->br).len)) {
      uVar14 = (uint)(0x40 < (dec->br).bit_pos);
    }
    (dec->br).eos = uVar14;
    if (((dec->incremental != 0) && (uVar14 != 0)) && (puVar22 < puVar2)) {
      dec->status = VP8_STATUS_SUSPENDED;
      iVar29 = (dec->saved_br).eos;
      (dec->br).bit_pos = (dec->saved_br).bit_pos;
      (dec->br).eos = iVar29;
      vVar9 = (dec->saved_br).val;
      puVar10 = (dec->saved_br).buf;
      sVar11 = (dec->saved_br).pos;
      (dec->br).len = (dec->saved_br).len;
      (dec->br).pos = sVar11;
      br->val = vVar9;
      (dec->br).buf = puVar10;
      dec->last_pixel = dec->saved_last_pixel;
      puVar22 = (uint32_t *)0x1;
      if (0 < (dec->hdr).color_cache_size) {
        VP8LColorCacheCopy(dst,src);
      }
      goto LAB_0013fbd6;
    }
    if ((dec->incremental != 0 && puVar2 <= puVar22) || (uVar14 == 0)) {
      if (process_func != (ProcessRowsFunc)0x0) {
        if (iVar29 < last_row) {
          last_row = iVar29;
        }
        (*process_func)(dec,last_row);
      }
      dec->status = VP8_STATUS_OK;
      dec->last_pixel = (int)((ulong)((long)puVar22 - (long)data) >> 2);
      puVar22 = (uint32_t *)0x1;
      goto LAB_0013fbd6;
    }
  }
  puVar22 = (uint32_t *)0x0;
  if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
    dec->status = VP8_STATUS_BITSTREAM_ERROR;
  }
LAB_0013fbd6:
  return (int)puVar22;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel / width;
  int col = dec->last_pixel % width;
  VP8LBitReader* const br = &dec->br;
  VP8LMetadata* const hdr = &dec->hdr;
  uint32_t* src = data + dec->last_pixel;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size;
  int next_sync_row = dec->incremental ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size > 0) ? &hdr->color_cache : NULL;
  const int mask = hdr->huffman_mask;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos = VP8LIsEndOfStream(br);
  // In incremental decoding:
  // br->eos && src < src_last: if 'br' reached the end of the buffer and
  // 'src_last' has not been reached yet, there is not enough data. 'dec' has to
  // be reset until there is more data.
  // !br->eos && src < src_last: this cannot happen as either the buffer is
  // fully read, either enough has been read to reach 'src_last'.
  // src >= src_last: 'src_last' is reached, all is fine. 'src' can actually go
  // beyond 'src_last' in case the image is cropped and an LZ77 goes further.
  // The buffer might have been enough or there is some left. 'br->eos' does
  // not matter.
  assert(!dec->incremental || (br->eos && src < src_last) || src >= src_last);
  if (dec->incremental && br->eos && src < src_last) {
    RestoreState(dec);
  } else if ((dec->incremental && src >= src_last) || !br->eos) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status = VP8_STATUS_OK;
    dec->last_pixel = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
}